

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astLexicalBlockNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  anon_struct_24_3_2a61c217 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *local_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.lexicalBlockNode = (sysbvm_astLexicalBlockNode_t *)0x0;
  gcFrame.childEnvironment = 0;
  gcFrame.analyzedBodyNode = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 3;
  local_20 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_38);
  gcFrame.lexicalBlockNode =
       (sysbvm_astLexicalBlockNode_t *)sysbvm_context_shallowCopy(context,*arguments);
  sVar1 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  ((gcFrame.lexicalBlockNode)->super).analyzerToken = sVar1;
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = ((gcFrame.lexicalBlockNode)->super).sourcePosition;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  gcFrame.childEnvironment = sysbvm_localAnalysisEnvironment_create(context,arguments[1]);
  gcFrame.analyzedBodyNode =
       sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                 (context,(gcFrame.lexicalBlockNode)->body,gcFrame.childEnvironment);
  (gcFrame.lexicalBlockNode)->body = gcFrame.analyzedBodyNode;
  (gcFrame.lexicalBlockNode)->bodyEnvironment = gcFrame.childEnvironment;
  if ((gcFrame.analyzedBodyNode & 0xf) == 0 && gcFrame.analyzedBodyNode != 0) {
    sVar1 = *(sysbvm_tuple_t *)(gcFrame.analyzedBodyNode + 0x20);
  }
  else {
    sVar1 = 0;
  }
  ((gcFrame.lexicalBlockNode)->super).analyzedType = sVar1;
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sysbvm_stackFrame_popRecord(&local_38);
  return (sysbvm_tuple_t)gcFrame.lexicalBlockNode;
}

Assistant:

static sysbvm_tuple_t sysbvm_astLexicalBlockNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astLexicalBlockNode_t *lexicalBlockNode;
        sysbvm_tuple_t childEnvironment;
        sysbvm_tuple_t analyzedBodyNode;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.lexicalBlockNode = (sysbvm_astLexicalBlockNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.lexicalBlockNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.lexicalBlockNode->super.sourcePosition);

    gcFrame.childEnvironment = sysbvm_localAnalysisEnvironment_create(context, *environment);
    gcFrame.analyzedBodyNode = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.lexicalBlockNode->body, gcFrame.childEnvironment);
    gcFrame.lexicalBlockNode->body = gcFrame.analyzedBodyNode;
    gcFrame.lexicalBlockNode->bodyEnvironment = gcFrame.childEnvironment;
    gcFrame.lexicalBlockNode->super.analyzedType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedBodyNode);
    
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.lexicalBlockNode;
}